

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeEntryPointData.cpp
# Opt level: O1

EntryPointPolymorphicInlineCacheInfo * __thiscall
NativeEntryPointData::EnsurePolymorphicInlineCacheInfo
          (NativeEntryPointData *this,Recycler *recycler,FunctionBody *functionBody)

{
  Type *addr;
  Recycler *alloc;
  EntryPointPolymorphicInlineCacheInfo *this_00;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  addr = &this->polymorphicInlineCacheInfo;
  if ((this->polymorphicInlineCacheInfo).ptr == (EntryPointPolymorphicInlineCacheInfo *)0x0) {
    local_48 = (undefined1  [8])&Js::EntryPointPolymorphicInlineCacheInfo::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_1c549c0;
    data.filename._0_4_ = 0x7f;
    alloc = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_48);
    this_00 = (EntryPointPolymorphicInlineCacheInfo *)new<Memory::Recycler>(0x38,alloc,0x38bbb2);
    Js::EntryPointPolymorphicInlineCacheInfo::EntryPointPolymorphicInlineCacheInfo
              (this_00,functionBody);
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = this_00;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  }
  return addr->ptr;
}

Assistant:

EntryPointPolymorphicInlineCacheInfo * 
NativeEntryPointData::EnsurePolymorphicInlineCacheInfo(Recycler * recycler, FunctionBody * functionBody)
{
    if (!polymorphicInlineCacheInfo)
    {
        polymorphicInlineCacheInfo = RecyclerNew(recycler, EntryPointPolymorphicInlineCacheInfo, functionBody);
    }
    return polymorphicInlineCacheInfo;
}